

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageOptions_SingleOptionSerializationAndDeserialization_Test
::TestBody(CoapTest_CoapMessageOptions_SingleOptionSerializationAndDeserialization_Test *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  shared_ptr<ot::commissioner::coap::Message> message;
  ContentFormat contentFormat;
  ByteArray buffer;
  Error error;
  AssertHelper local_c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  undefined8 *local_b0;
  undefined1 local_a8 [40];
  shared_ptr<ot::commissioner::coap::Message> local_80;
  ContentFormat local_6c;
  ByteArray local_68;
  undefined1 local_48 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,1);
  local_80.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (Message *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::coap::Message,std::allocator<ot::commissioner::coap::Message>,ot::commissioner::coap::Type,ot::commissioner::coap::Code>
            (&local_80.
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Message **)&local_80,
             (allocator<ot::commissioner::coap::Message> *)local_48,local_a8,(Code *)&local_68);
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._0_4_ = kNone;
  local_48._16_8_ = 0;
  local_30._M_local_buf[0] = '\0';
  local_48._8_8_ = &local_30;
  Message::SetContentFormat
            ((Error *)local_a8,
             local_80.
             super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             kCBOR);
  local_c0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_b8,"message->SetContentFormat(ContentFormat::kCBOR)",
             "ErrorCode::kNone",(Error *)local_a8,(ErrorCode *)&local_c0);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x18);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ != p_Var1) {
    operator_delete((void *)local_a8._8_8_);
  }
  if (local_b8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_b0 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xc4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((Message *)local_a8._0_8_ != (Message *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  puVar2 = local_b0;
  if (local_b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b0 != local_b0 + 2) {
      operator_delete((undefined8 *)*local_b0);
    }
    operator_delete(puVar2);
  }
  Message::Serialize((Error *)local_a8,
                     local_80.
                     super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_68);
  local_c0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_b8,"message->Serialize(buffer)","ErrorCode::kNone",(Error *)local_a8
             ,(ErrorCode *)&local_c0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ != p_Var1) {
    operator_delete((void *)local_a8._8_8_);
  }
  if (local_b8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_b0 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xc5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((Message *)local_a8._0_8_ != (Message *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  puVar2 = local_b0;
  if (local_b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b0 != local_b0 + 2) {
      operator_delete((undefined8 *)*local_b0);
    }
    operator_delete(puVar2);
  }
  local_b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_c0.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_a8,"buffer.size()","4 + 2",(unsigned_long *)&local_b8,
             (int *)&local_c0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,199,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  uVar3 = local_a8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._8_8_ + 0x10)) {
      operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_b8._M_head_impl._0_4_ = 0xc1;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_a8,"buffer[4]","0xc1",
             local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 4,(int *)&local_b8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,200,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  uVar3 = local_a8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._8_8_ + 0x10)) {
      operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_b8._M_head_impl._0_4_ = 0x3c;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_int>
            ((internal *)local_a8,"buffer[5]","utils::to_underlying(ContentFormat::kCBOR)",
             local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 5,(uint *)&local_b8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xc9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  uVar3 = local_a8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._8_8_ + 0x10)) {
      operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  Message::Deserialize((Message *)local_a8,(Error *)local_48,&local_68);
  this_00._M_pi =
       local_80.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_80.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
  local_80.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8._0_8_;
  local_a8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  local_b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)local_a8,"message","nullptr",&local_80,&local_b8._M_head_impl);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xcc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  uVar3 = local_a8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._8_8_ + 0x10)) {
      operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_b8._M_head_impl = local_b8._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)local_a8,"error","ErrorCode::kNone",(Error *)local_48,
             (ErrorCode *)&local_b8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xcd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  uVar3 = local_a8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._8_8_ + 0x10)) {
      operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((local_80.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->mOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_c0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_a8,"message->GetOptionNum()","1",(unsigned_long *)&local_b8,
             (int *)&local_c0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xcf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  uVar3 = local_a8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._8_8_ + 0x10)) {
      operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  Message::GetContentFormat
            ((Error *)local_a8,
             local_80.
             super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_6c);
  local_c0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_b8,"message->GetContentFormat(contentFormat)","ErrorCode::kNone",
             (Error *)local_a8,(ErrorCode *)&local_c0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ != p_Var1) {
    operator_delete((void *)local_a8._8_8_);
  }
  if (local_b8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_b0 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xd2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (local_b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_b0 != local_b0 + 2) {
      operator_delete((undefined8 *)*local_b0);
    }
    operator_delete(local_b0);
  }
  local_b8._M_head_impl._0_4_ = 0x3c;
  testing::internal::
  CmpHelperEQ<ot::commissioner::coap::ContentFormat,ot::commissioner::coap::ContentFormat>
            ((internal *)local_a8,"contentFormat","ContentFormat::kCBOR",&local_6c,
             (ContentFormat *)&local_b8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xd3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  uVar3 = local_a8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._8_8_ + 0x10)) {
      operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_a8._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._8_8_ != &local_30) {
    operator_delete((void *)local_48._8_8_);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.
               super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(CoapTest, CoapMessageOptions_SingleOptionSerializationAndDeserialization)
{
    auto      message = std::make_shared<Message>(Type::kConfirmable, Code::kGet);
    ByteArray buffer;
    Error     error;

    EXPECT_EQ(message->SetContentFormat(ContentFormat::kCBOR), ErrorCode::kNone);
    EXPECT_EQ(message->Serialize(buffer), ErrorCode::kNone);

    EXPECT_EQ(buffer.size(), 4 + 2);
    EXPECT_EQ(buffer[4], 0xc1);
    EXPECT_EQ(buffer[5], utils::to_underlying(ContentFormat::kCBOR));

    message = Message::Deserialize(error, buffer);
    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetOptionNum(), 1);

    ContentFormat contentFormat;
    EXPECT_EQ(message->GetContentFormat(contentFormat), ErrorCode::kNone);
    EXPECT_EQ(contentFormat, ContentFormat::kCBOR);
}